

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_srgb(spng_ctx *ctx,uint8_t rendering_intent)

{
  int ret;
  uint8_t rendering_intent_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (ctx == (spng_ctx *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      if (rendering_intent < 4) {
        ctx->srgb_rendering_intent = rendering_intent;
        ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xffffffbf | 0x40);
        ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xffffffbf | 0x40);
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 1;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_srgb(spng_ctx *ctx, uint8_t rendering_intent)
{
    SPNG_SET_CHUNK_BOILERPLATE(ctx);

    if(rendering_intent > 3) return 1;

    ctx->srgb_rendering_intent = rendering_intent;

    ctx->stored.srgb = 1;
    ctx->user.srgb = 1;

    return 0;
}